

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXPrintHandlers.cpp
# Opt level: O1

void __thiscall SAXPrintHandlers::writeChars(SAXPrintHandlers *this)

{
  long in_RSI;
  
  std::ostream::write((char *)&std::cout,in_RSI);
  std::ostream::flush();
  return;
}

Assistant:

void SAXPrintHandlers::writeChars(const XMLByte* const toWrite,
                                  const XMLSize_t      count,
                                  XMLFormatter* const /* formatter */)
{
    // For this one, just dump them to the standard output
    // Surprisingly, Solaris was the only platform on which
    // required the char* cast to print out the string correctly.
    // Without the cast, it was printing the pointer value in hex.
    // Quite annoying, considering every other platform printed
    // the string with the explicit cast to char* below.
    std::cout.write((char *) toWrite, (int) count);
	std::cout.flush();
}